

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::enclose_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  int iVar4;
  char *in_R8;
  undefined1 local_a;
  spirv_cross local_9;
  
  pbVar2 = (byte *)(expr->_M_dataplus)._M_p;
  if (expr->_M_string_length != 0) {
    bVar1 = *pbVar2;
    if ((((ulong)bVar1 < 0x2e) && ((0x2c4200000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       (bVar1 == 0x7e)) {
LAB_00210d73:
      local_9 = (spirv_cross)0x28;
      local_a = 0x29;
      join<char,std::__cxx11::string_const&,char>
                (__return_storage_ptr__,&local_9,(char *)expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a,in_R8
                );
      return __return_storage_ptr__;
    }
  }
  sVar3 = 0;
  iVar4 = 0;
  do {
    if (expr->_M_string_length == sVar3) {
      if (iVar4 == 0) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
        return __return_storage_ptr__;
      }
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0xf32,"string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
    }
    bVar1 = pbVar2[sVar3];
    if (bVar1 == 0x28) {
LAB_00210db8:
      iVar4 = iVar4 + 1;
    }
    else if ((bVar1 == 0x29) || (bVar1 == 0x5d)) {
      if (iVar4 == 0) {
        __assert_fail("paren_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0xf29,"string spirv_cross::CompilerGLSL::enclose_expression(const string &)")
        ;
      }
      iVar4 = iVar4 + -1;
    }
    else {
      if (bVar1 == 0x5b) goto LAB_00210db8;
      in_R8 = (char *)(ulong)(bVar1 == 0x20);
      if (bVar1 == 0x20 && iVar4 == 0) goto LAB_00210d73;
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (need_parens)
		return join('(', expr, ')');
	else
		return expr;
}